

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VmaAllocHandle __thiscall
VmaBlockMetadata_TLSF::GetNextAllocation(VmaBlockMetadata_TLSF *this,VmaAllocHandle prevAlloc)

{
  bool bVar1;
  long in_RSI;
  Block *block;
  Block *startBlock;
  Block *local_28;
  
  local_28 = *(Block **)(in_RSI + 0x10);
  while( true ) {
    if (local_28 == (Block *)0x0) {
      return (VmaAllocHandle)0x0;
    }
    bVar1 = Block::IsFree(local_28);
    if (!bVar1) break;
    local_28 = local_28->prevPhysical;
  }
  return (VmaAllocHandle)local_28;
}

Assistant:

VmaAllocHandle VmaBlockMetadata_TLSF::GetNextAllocation(VmaAllocHandle prevAlloc) const
{
    Block* startBlock = (Block*)prevAlloc;
    VMA_ASSERT(!startBlock->IsFree() && "Incorrect block!");

    for (Block* block = startBlock->prevPhysical; block; block = block->prevPhysical)
    {
        if (!block->IsFree())
            return (VmaAllocHandle)block;
    }
    return VK_NULL_HANDLE;
}